

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpbrk.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  
  pcVar1 = strpbrk("abcde","x");
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2a,"strpbrk( abcde, \"x\" ) == NULL");
  }
  pcVar1 = strpbrk("abcde","xyz");
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2b,"strpbrk( abcde, \"xyz\" ) == NULL");
  }
  pcVar1 = strpbrk("abcdx","x");
  if (pcVar1 != "x") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2c,"strpbrk( abcdx, \"x\" ) == &abcdx[4]");
  }
  pcVar1 = strpbrk("abcdx","xyz");
  if (pcVar1 != "x") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2d,"strpbrk( abcdx, \"xyz\" ) == &abcdx[4]");
  }
  pcVar1 = strpbrk("abcdx","zyx");
  if (pcVar1 != "x") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2e,"strpbrk( abcdx, \"zyx\" ) == &abcdx[4]");
  }
  pcVar1 = strpbrk("abcde","a");
  if (pcVar1 != "abcde") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x2f,"strpbrk( abcde, \"a\" ) == &abcde[0]");
  }
  pcVar1 = strpbrk("abcde","abc");
  if (pcVar1 != "abcde") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x30,"strpbrk( abcde, \"abc\" ) == &abcde[0]");
  }
  pcVar1 = strpbrk("abcde","cba");
  if (pcVar1 != "abcde") {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strpbrk.c, line %d - %s\n"
           ,0x31,"strpbrk( abcde, \"cba\" ) == &abcde[0]");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( strpbrk( abcde, "x" ) == NULL );
    TESTCASE( strpbrk( abcde, "xyz" ) == NULL );
    TESTCASE( strpbrk( abcdx, "x" ) == &abcdx[4] );
    TESTCASE( strpbrk( abcdx, "xyz" ) == &abcdx[4] );
    TESTCASE( strpbrk( abcdx, "zyx" ) == &abcdx[4] );
    TESTCASE( strpbrk( abcde, "a" ) == &abcde[0] );
    TESTCASE( strpbrk( abcde, "abc" ) == &abcde[0] );
    TESTCASE( strpbrk( abcde, "cba" ) == &abcde[0] );
    return TEST_RESULTS;
}